

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeCommand.cxx
# Opt level: O1

bool __thiscall
cmIncludeCommand::InitialPass
          (cmIncludeCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  cmMakefile *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  PolicyStatus PVar9;
  char *pcVar10;
  cmGlobalGenerator *this_00;
  ostream *poVar11;
  size_t sVar12;
  PolicyID id;
  _Alloc_hider _Var13;
  MessageType t;
  pointer pbVar14;
  uint uVar15;
  ulong uVar16;
  string m;
  string fname_abs;
  string fname;
  string resultVarName;
  string listFile;
  bool local_230;
  allocator local_229;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar14 || 0x80 < (ulong)((long)pbVar2 - (long)pbVar14)) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "called with wrong number of arguments.  include() only takes one file.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    return false;
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  pcVar3 = (pbVar14->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar3,pcVar3 + pbVar14->_M_string_length);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x21) {
    bVar7 = false;
    local_230 = false;
  }
  else {
    uVar16 = 1;
    local_230 = false;
    bVar7 = false;
    do {
      uVar15 = (uint)uVar16;
      iVar8 = std::__cxx11::string::compare((char *)(pbVar14 + uVar16));
      if (iVar8 == 0) {
        bVar5 = !bVar7;
        bVar7 = true;
        if (bVar5) goto LAB_0029e7c4;
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"called with invalid arguments: OPTIONAL used twice","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
LAB_0029eb43:
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
LAB_0029eb50:
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
LAB_0029eb60:
        bVar5 = false;
        goto LAB_0029ee5a;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar8 == 0) {
        if (local_1c8._M_string_length == 0) {
          uVar15 = uVar15 + 1;
          if ((ulong)uVar15 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&local_1c8);
            goto LAB_0029e7c4;
          }
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"called with no value for RESULT_VARIABLE.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        }
        else {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,
                     "called with invalid arguments: only one result variable allowed","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        }
        goto LAB_0029eb43;
      }
      iVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar8 != 0) {
        if (uVar15 < 2) goto LAB_0029e7c4;
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"called with invalid argument: ","");
        std::__cxx11::string::_M_append
                  (local_1a8,
                   (ulong)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) goto LAB_0029eb50;
        goto LAB_0029eb60;
      }
      local_230 = true;
LAB_0029e7c4:
      uVar16 = (ulong)(uVar15 + 1);
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5
                             ));
  }
  if ((char *)local_1e8._M_string_length == (char *)0x0) {
    pcVar4 = (this->super_cmCommand).Makefile;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"include() given empty file name (ignored).","");
    cmMakefile::IssueMessage(pcVar4,AUTHOR_WARNING,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar5 = true;
    goto LAB_0029ee5a;
  }
  bVar5 = cmsys::SystemTools::FileIsFullPath(local_1e8._M_dataplus._M_p);
  if (!bVar5) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               (char *)(local_1e8._M_string_length + (long)local_1e8._M_dataplus._M_p));
    std::__cxx11::string::append(local_1a8);
    cmMakefile::GetModulesFile_abi_cxx11_
              (&local_208,(this->super_cmCommand).Makefile,(char *)local_1a8._0_8_);
    _Var13._M_p = local_208._M_dataplus._M_p;
    if (local_208._M_string_length != 0) {
      strlen(local_208._M_dataplus._M_p);
      std::__cxx11::string::_M_replace
                ((ulong)&local_1e8,0,(char *)local_1e8._M_string_length,(ulong)_Var13._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  pcVar10 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
  cmsys::SystemTools::CollapseFullPath(&local_208,&local_1e8,pcVar10);
  this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
  bVar5 = cmGlobalGenerator::IsExportedTargetsFile(this_00,&local_208);
  if (bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    PVar9 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0024);
    if (PVar9 - NEW < 3) {
      t = FATAL_ERROR;
      bVar6 = true;
      pcVar10 = "may";
      bVar5 = false;
    }
    else {
      if (PVar9 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_228,(cmPolicies *)0x18,id);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_228._M_dataplus._M_p,
                             local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        bVar5 = false;
        pcVar10 = "should";
      }
      else {
        pcVar10 = (char *)0x0;
        bVar5 = true;
      }
      bVar6 = false;
      t = AUTHOR_WARNING;
    }
    if (bVar5) {
LAB_0029ec87:
      cmGlobalGenerator::GenerateImportFile(this_00,&local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      goto LAB_0029ecb5;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The file\n  ",0xb);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\nwas generated by the export() command.  It ",0x2c);
    sVar12 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,
               " not be used as the argument to the include() command.  Use ALIAS targets instead to refer to targets by alternative names.\n"
               ,0x7c);
    pcVar4 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar4,t,&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (!bVar6) goto LAB_0029ec87;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar5 = false;
  }
  else {
LAB_0029ecb5:
    std::__cxx11::string::string((string *)&local_228,local_1e8._M_dataplus._M_p,&local_229);
    pcVar10 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    cmsys::SystemTools::CollapseFullPath((string *)local_1a8,&local_228,pcVar10);
    paVar1 = &local_228.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((!bVar7) || (bVar5 = cmsys::SystemTools::FileExists((char *)local_1a8._0_8_), bVar5)) {
      bVar6 = cmMakefile::ReadDependentFile
                        ((this->super_cmCommand).Makefile,(char *)local_1a8._0_8_,local_230);
      if (local_1c8._M_string_length != 0) {
        _Var13._M_p = local_208._M_dataplus._M_p;
        if (!bVar6) {
          _Var13._M_p = "NOTFOUND";
        }
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_1c8,_Var13._M_p);
      }
      bVar5 = true;
      if (((!bVar6 && !bVar7) && (cmSystemTools::s_FatalErrorOccured == false)) &&
         (bVar7 = cmSystemTools::GetInterruptFlag(), !bVar7)) {
        local_228._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,"could not find load file:\n  ","");
        std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1e8._M_dataplus._M_p);
        cmCommand::SetError(&this->super_cmCommand,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar1) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        bVar5 = false;
      }
    }
    else {
      bVar5 = true;
      if (local_1c8._M_string_length != 0) {
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_1c8,"NOTFOUND");
      }
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
LAB_0029ee5a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool cmIncludeCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if (args.size()< 1 || args.size() > 4)
    {
      this->SetError("called with wrong number of arguments.  "
                     "include() only takes one file.");
      return false;
    }
  bool optional = false;
  bool noPolicyScope = false;
  std::string fname = args[0];
  std::string resultVarName;

  for (unsigned int i=1; i<args.size(); i++)
    {
    if (args[i] == "OPTIONAL")
      {
      if (optional)
        {
        this->SetError("called with invalid arguments: OPTIONAL used twice");
        return false;
        }
      optional = true;
      }
    else if(args[i] == "RESULT_VARIABLE")
      {
      if (!resultVarName.empty())
        {
        this->SetError("called with invalid arguments: "
            "only one result variable allowed");
        return false;
        }
      if(++i < args.size())
        {
        resultVarName = args[i];
        }
      else
        {
        this->SetError("called with no value for RESULT_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "NO_POLICY_SCOPE")
      {
      noPolicyScope = true;
      }
      else if(i > 1)  // compat.: in previous cmake versions the second
                      // parameter was ignored if it wasn't "OPTIONAL"
        {
        std::string errorText = "called with invalid argument: ";
        errorText += args[i];
        this->SetError(errorText);
        return false;
        }
    }

  if(fname.empty())
    {
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
                                 "include() given empty file name (ignored).");
    return true;
    }

  if(!cmSystemTools::FileIsFullPath(fname.c_str()))
    {
    // Not a path. Maybe module.
    std::string module = fname;
    module += ".cmake";
    std::string mfile = this->Makefile->GetModulesFile(module.c_str());
    if (!mfile.empty())
      {
      fname = mfile.c_str();
      }
    }

  std::string fname_abs =
      cmSystemTools::CollapseFullPath(fname,
                                 this->Makefile->GetCurrentSourceDirectory());

  cmGlobalGenerator *gg = this->Makefile->GetGlobalGenerator();
  if (gg->IsExportedTargetsFile(fname_abs))
    {
    const char *modal = 0;
    std::ostringstream e;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;

    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0024))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0024) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        modal = "may";
        messageType = cmake::FATAL_ERROR;
      }
    if (modal)
      {
      e << "The file\n  " << fname_abs << "\nwas generated by the export() "
        "command.  It " << modal << " not be used as the argument to the "
        "include() command.  Use ALIAS targets instead to refer to targets "
        "by alternative names.\n";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    gg->GenerateImportFile(fname_abs);
    }

  std::string listFile =
    cmSystemTools::CollapseFullPath(fname.c_str(),
                                  this->Makefile->GetCurrentSourceDirectory());
  if(optional && !cmSystemTools::FileExists(listFile.c_str()))
    {
    if (!resultVarName.empty())
      {
      this->Makefile->AddDefinition(resultVarName, "NOTFOUND");
      }
    return true;
    }

  bool readit =
    this->Makefile->ReadDependentFile(listFile.c_str(), noPolicyScope);

  // add the location of the included file if a result variable was given
  if (!resultVarName.empty())
    {
      this->Makefile->AddDefinition(resultVarName,
                                    readit?fname_abs.c_str():"NOTFOUND");
    }

  if(!optional && !readit && !cmSystemTools::GetFatalErrorOccured())
    {
    std::string m =
      "could not find load file:\n"
      "  ";
    m += fname;
    this->SetError(m);
    return false;
    }
  return true;
}